

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

void xcb_input_feedback_ctl_next(xcb_input_feedback_ctl_iterator_t *i)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  xcb_input_feedback_ctl_t *R;
  xcb_generic_iterator_t child;
  int local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RDI;
  iVar3 = xcb_input_feedback_ctl_sizeof(in_RDI);
  local_18 = (int)(lVar2 + iVar3);
  *(int *)((long)in_RDI + 0xc) = local_18 - (int)*in_RDI;
  *(int *)(in_RDI + 1) = (int)in_RDI[1] + -1;
  *in_RDI = lVar2 + iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
xcb_input_feedback_ctl_next (xcb_input_feedback_ctl_iterator_t *i)
{
    xcb_input_feedback_ctl_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_feedback_ctl_t *)(((char *)R) + xcb_input_feedback_ctl_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_feedback_ctl_t *) child.data;
}